

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::try_load(info *this,istream *is,entry_types entries,codepage_id force_codepage)

{
  entry_types entries_00;
  bool bVar1;
  undefined1 uVar2;
  enum_type entry_type;
  uint uVar3;
  TypesafeBoolean p_Var4;
  type pbVar5;
  type pbVar6;
  reference pvVar7;
  auto_any<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> result;
  _Base_bitset<1UL> entries_01;
  type version;
  header *header;
  info *info;
  type what;
  int_type_conflict2 in_ECX;
  info *in_RDX;
  _Base_bitset<1UL> in_RDI;
  language_entry *language_1;
  bool _foreach_continue186;
  auto_any_t _foreach_end186;
  auto_any_t _foreach_cur186;
  auto_any_t _foreach_col186;
  language_entry *language;
  bool _foreach_continue177;
  auto_any_t _foreach_end177;
  auto_any_t _foreach_cur177;
  auto_any_t _foreach_col177;
  pointer reader;
  version *in_stack_000002f0;
  istream *in_stack_000002f8;
  header *in_stack_00000300;
  version *in_stack_00000e60;
  istream *in_stack_00000e68;
  false_ *in_stack_fffffffffffffd38;
  header *in_stack_fffffffffffffd40;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *this_00;
  _Base_bitset<1UL> in_stack_fffffffffffffd48;
  auto_any_t in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd88;
  enum_type eVar8;
  vector<setup::permission_entry,_std::allocator<setup::permission_entry>_>
  *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  info *in_stack_fffffffffffffda0;
  info *in_stack_fffffffffffffda8;
  _Base_bitset<1UL> in_stack_fffffffffffffdb0;
  istream *in_stack_fffffffffffffdb8;
  enum_type entry_type_00;
  _Base_bitset<1UL> in_stack_fffffffffffffdc0;
  type in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  _Base_bitset<1UL> in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffded;
  byte in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  __normal_iterator<setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  __normal_iterator<setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  in_stack_fffffffffffffe00;
  byte local_1da;
  __normal_iterator<setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  in_stack_fffffffffffffe38;
  enum_type entry_type_01;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  vector<setup::language_entry,_std::allocator<setup::language_entry>_> *in_stack_fffffffffffffe48;
  istream *in_stack_fffffffffffffe50;
  auto_any<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>
  in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  enum_type entry_type_02;
  vector<setup::component_entry,_std::allocator<setup::component_entry>_> *result_00;
  int_adapter<unsigned_int> *count;
  undefined7 in_stack_fffffffffffffe88;
  byte in_stack_fffffffffffffe8f;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  enum_type entry_type_03;
  _Base_bitset<1UL> in_stack_fffffffffffffea0;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
  in_stack_fffffffffffffea8;
  istream *in_stack_fffffffffffffeb0;
  info *in_stack_fffffffffffffeb8;
  _Base_bitset<1UL> in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  istream *in_stack_fffffffffffffed0;
  info *in_stack_fffffffffffffed8;
  _Base_bitset<1UL> in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  enum_type eVar9;
  vector<setup::language_entry,_std::allocator<setup::language_entry>_> *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  undefined4 entry_type_04;
  istream *in_stack_ffffffffffffff00;
  undefined8 result_01;
  info *in_stack_ffffffffffffff08;
  undefined8 count_00;
  _Base_bitset<1UL> in_stack_ffffffffffffff10;
  undefined8 is_00;
  undefined8 this_01;
  undefined8 entries_02;
  undefined8 in_stack_ffffffffffffff28;
  _Base_bitset<1UL> in_stack_ffffffffffffff30;
  bool local_c1;
  __normal_iterator<setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  local_c0;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_b8;
  __normal_iterator<setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  local_b0;
  undefined8 in_stack_ffffffffffffff58;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *this_02;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *this_03;
  istream *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  bool in_stack_ffffffffffffff7f;
  __normal_iterator<setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  in_stack_ffffffffffffff80;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *in_stack_ffffffffffffff88;
  enum_type entry_type_05;
  __normal_iterator<setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  in_stack_ffffffffffffff90;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *in_stack_ffffffffffffff98;
  auto_any<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>
  in_stack_ffffffffffffffa0;
  _Base_bitset<1UL> in_stack_ffffffffffffffa8;
  undefined8 entries_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  int_type_conflict2 local_1c;
  undefined8 local_8;
  
  eVar9 = (enum_type)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_1c = in_ECX;
  local_8 = in_RDX;
  local_30._M_allocated_capacity =
       (size_type)
       operator|((enum_type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                 (enum_type)in_stack_fffffffffffffd38);
  local_30._8_8_ =
       flags<setup::directory_entry::flags_Enum_,_5UL>::operator&
                 ((flags<setup::directory_entry::flags_Enum_,_5UL> *)in_stack_fffffffffffffd40,
                  (flags<setup::directory_entry::flags_Enum_,_5UL>)in_stack_fffffffffffffd48._M_w);
  p_Var4 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x177a17);
  entry_type_03 = CONCAT13(1,(int3)in_stack_fffffffffffffe9c);
  if (p_Var4 == (TypesafeBoolean)0x0) {
    bVar1 = setup::version::is_unicode((version *)in_stack_fffffffffffffd40);
    in_stack_fffffffffffffe8f = 0;
    if (!bVar1) {
      in_stack_fffffffffffffe8f = local_1c != 0 ^ 0xff;
    }
    entry_type_03 = CONCAT13(in_stack_fffffffffffffe8f,(int3)entry_type_03);
  }
  if ((entry_type_03 & 0x1000000) != Components) {
    flags<setup::info::entry_types_Enum_,_21UL>::operator|=
              ((flags<setup::info::entry_types_Enum_,_21UL> *)in_stack_fffffffffffffd50,
               (enum_type)(in_stack_fffffffffffffd48._M_w >> 0x20));
  }
  result_00 = (vector<setup::component_entry,_std::allocator<setup::component_entry>_> *)
              &stack0xffffffffffffffc8;
  stream::block_reader::get(in_stack_00000e68,in_stack_00000e60);
  count = (int_adapter<unsigned_int> *)(in_RDI._M_w + 0x20);
  pbVar5 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd40);
  setup::header::load(in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
  pbVar6 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd40);
  entries_03 = local_8;
  load_entries<setup::language_entry>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (entry_types)in_stack_ffffffffffffff10._M_w,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0,eVar9);
  uVar2 = setup::version::is_unicode((version *)in_stack_fffffffffffffd40);
  eVar9 = (enum_type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if ((bool)uVar2) {
    ((int_adapter<unsigned_int> *)(in_RDI._M_w + 0x18))->value_ = 0x4b0;
  }
  else if (local_1c == 0) {
    bVar1 = std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::empty
                      ((vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
                       in_stack_fffffffffffffd50);
    eVar9 = (enum_type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (bVar1) {
      ((int_adapter<unsigned_int> *)(in_RDI._M_w + 0x18))->value_ = 0x4e4;
    }
    else {
      in_stack_fffffffffffffe48 =
           (vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
           (in_RDI._M_w + 0x760);
      in_stack_fffffffffffffe50 = (istream *)0x0;
      pvVar7 = std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::
               operator[](in_stack_fffffffffffffe48,0);
      ((int_adapter<unsigned_int> *)(in_RDI._M_w + 0x18))->value_ = pvVar7->codepage;
      in_stack_fffffffffffffe58 =
           boost::foreach_detail_::contain<std::__cxx11::string_const>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffd48._M_w,(false_ *)in_stack_fffffffffffffd40);
      in_stack_ffffffffffffffa8._M_w = (_WordT)&stack0xffffffffffffffa0;
      in_stack_ffffffffffffffa0 = in_stack_fffffffffffffe58;
      in_stack_fffffffffffffe47 =
           boost::iostreams::detail::
           indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
           ::can_write((indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                        *)in_stack_ffffffffffffffa8._M_w);
      eVar9 = (enum_type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
      if (!(bool)in_stack_fffffffffffffe47) {
        in_stack_fffffffffffffe38._M_current =
             (language_entry *)
             boost::foreach_detail_::
             begin<std::vector<setup::language_entry,std::allocator<setup::language_entry>>,mpl_::bool_<false>>
                       ((auto_any_t)in_stack_fffffffffffffd48._M_w,
                        (type2type<std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>,_mpl_::bool_<false>_>
                         *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        in_stack_ffffffffffffff98 =
             (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              *)&stack0xffffffffffffff90;
        in_stack_ffffffffffffff90._M_current = in_stack_fffffffffffffe38._M_current;
        bVar1 = boost::iostreams::detail::
                indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                ::can_write(in_stack_ffffffffffffff98);
        eVar9 = (enum_type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        if (!bVar1) {
          in_stack_ffffffffffffff80._M_current =
               (language_entry *)
               boost::foreach_detail_::
               end<std::vector<setup::language_entry,std::allocator<setup::language_entry>>,mpl_::bool_<false>>
                         ((auto_any_t)in_stack_fffffffffffffd48._M_w,
                          (type2type<std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>,_mpl_::bool_<false>_>
                           *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          in_stack_ffffffffffffff88 =
               (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                *)&stack0xffffffffffffff80;
          bVar1 = boost::iostreams::detail::
                  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  ::can_write(in_stack_ffffffffffffff88);
          eVar9 = (enum_type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
          if (!bVar1) {
            in_stack_ffffffffffffff7f = true;
            while( true ) {
              local_1da = 0;
              if ((in_stack_ffffffffffffff7f & 1U) != 0) {
                bVar1 = boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                                  (in_stack_fffffffffffffd50,
                                   (auto_any_t)in_stack_fffffffffffffd48._M_w,
                                   (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                    *)in_stack_fffffffffffffd40);
                local_1da = bVar1 ^ 0xff;
              }
              eVar9 = (enum_type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
              if ((local_1da & 1) == 0) break;
              bVar1 = boost::foreach_detail_::set_false((bool *)&stack0xffffffffffffff7f);
              if (!bVar1) {
                in_stack_ffffffffffffff70 =
                     (istream *)
                     boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                               ((auto_any_t)in_stack_fffffffffffffd40,
                                (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                 *)in_stack_fffffffffffffd38);
                while (((in_stack_ffffffffffffff7f ^ 0xffU) & 1) != 0) {
                  if (*(int *)&in_stack_ffffffffffffff70[1].field_0x2c == 0x4e4) {
                    ((int_adapter<unsigned_int> *)(in_RDI._M_w + 0x18))->value_ = 0x4e4;
                    break;
                  }
                  in_stack_ffffffffffffff7f = true;
                }
              }
              if ((in_stack_ffffffffffffff7f & 1U) != 0) {
                boost::foreach_detail_::
                next<std::vector<setup::language_entry,std::allocator<setup::language_entry>>,mpl_::bool_<false>>
                          ((auto_any_t)in_stack_fffffffffffffd40,
                           (type2type<std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>,_mpl_::bool_<true>_>
                            *)in_stack_fffffffffffffd38);
              }
            }
          }
        }
      }
    }
  }
  else {
    ((int_adapter<unsigned_int> *)(in_RDI._M_w + 0x18))->value_ = local_1c;
  }
  setup::header::decode
            (in_stack_fffffffffffffd40,(codepage_id)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  result = boost::foreach_detail_::contain<std::__cxx11::string_const>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffd48._M_w,(false_ *)in_stack_fffffffffffffd40);
  this_03 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
             *)&stack0xffffffffffffff60;
  bVar1 = boost::iostreams::detail::
          indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
          ::can_write(this_03);
  entry_type_05 = (enum_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  entry_type_02 = (enum_type)((ulong)pbVar6 >> 0x20);
  entry_type_01 = (enum_type)((ulong)in_stack_fffffffffffffe38._M_current >> 0x20);
  eVar8 = (enum_type)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  if (!bVar1) {
    in_stack_fffffffffffffe00._M_current =
         (language_entry *)
         boost::foreach_detail_::
         begin<std::vector<setup::language_entry,std::allocator<setup::language_entry>>,mpl_::bool_<false>>
                   ((auto_any_t)in_stack_fffffffffffffd48._M_w,
                    (type2type<std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>,_mpl_::bool_<false>_>
                     *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    this_02 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
               *)&local_b0;
    local_b0._M_current = in_stack_fffffffffffffe00._M_current;
    in_stack_fffffffffffffdff =
         boost::iostreams::detail::
         indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
         ::can_write(this_02);
    eVar9 = (enum_type)((ulong)this_02 >> 0x20);
    entry_type_05 = (enum_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    entry_type_02 = (enum_type)((ulong)pbVar6 >> 0x20);
    entry_type_01 = (enum_type)((ulong)in_stack_fffffffffffffe38._M_current >> 0x20);
    eVar8 = (enum_type)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    if (!(bool)in_stack_fffffffffffffdff) {
      in_stack_fffffffffffffdf0._M_current =
           (language_entry *)
           boost::foreach_detail_::
           end<std::vector<setup::language_entry,std::allocator<setup::language_entry>>,mpl_::bool_<false>>
                     ((auto_any_t)in_stack_fffffffffffffd48._M_w,
                      (type2type<std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>,_mpl_::bool_<false>_>
                       *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_b8 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  *)&local_c0;
      local_c0._M_current = in_stack_fffffffffffffdf0._M_current;
      in_stack_fffffffffffffdef =
           boost::iostreams::detail::
           indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
           ::can_write(local_b8);
      eVar9 = (enum_type)((ulong)this_02 >> 0x20);
      entry_type_05 = (enum_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      entry_type_02 = (enum_type)((ulong)pbVar6 >> 0x20);
      entry_type_01 = (enum_type)((ulong)in_stack_fffffffffffffe38._M_current >> 0x20);
      eVar8 = (enum_type)((ulong)in_stack_fffffffffffffd88 >> 0x20);
      if (!(bool)in_stack_fffffffffffffdef) {
        local_c1 = true;
        while( true ) {
          in_stack_fffffffffffffdee = 0;
          if ((local_c1 & 1U) != 0) {
            in_stack_fffffffffffffded =
                 boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                           (in_stack_fffffffffffffd50,(auto_any_t)in_stack_fffffffffffffd48._M_w,
                            (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                             *)in_stack_fffffffffffffd40);
            in_stack_fffffffffffffdee = in_stack_fffffffffffffded ^ 0xff;
          }
          eVar9 = (enum_type)((ulong)this_02 >> 0x20);
          entry_type_05 = (enum_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
          entry_type_02 = (enum_type)((ulong)pbVar6 >> 0x20);
          entry_type_01 = (enum_type)((ulong)in_stack_fffffffffffffe38._M_current >> 0x20);
          eVar8 = (enum_type)((ulong)in_stack_fffffffffffffd88 >> 0x20);
          if ((in_stack_fffffffffffffdee & 1) == 0) break;
          in_stack_fffffffffffffdec = boost::foreach_detail_::set_false(&local_c1);
          if (!(bool)in_stack_fffffffffffffdec) {
            in_stack_fffffffffffffde0._M_w =
                 (_WordT)boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                                   ((auto_any_t)in_stack_fffffffffffffd40,
                                    (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                     *)in_stack_fffffffffffffd38);
            in_stack_ffffffffffffff30._M_w = in_stack_fffffffffffffde0._M_w;
            while (((local_c1 ^ 0xffU) & 1) != 0) {
              language_entry::decode
                        ((language_entry *)in_stack_fffffffffffffd40,
                         (codepage_id)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              local_c1 = true;
            }
          }
          if ((local_c1 & 1U) != 0) {
            boost::foreach_detail_::
            next<std::vector<setup::language_entry,std::allocator<setup::language_entry>>,mpl_::bool_<false>>
                      ((auto_any_t)in_stack_fffffffffffffd40,
                       (type2type<std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>,_mpl_::bool_<true>_>
                        *)in_stack_fffffffffffffd38);
          }
        }
      }
    }
  }
  entry_type = boost::date_time::int_adapter<unsigned_int>::as_number
                         ((int_adapter<unsigned_int> *)in_RDI._M_w);
  if (entry_type < 0x4000000) {
    in_stack_fffffffffffffdd0 =
         std::
         unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
         ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      *)in_stack_fffffffffffffd40);
    in_stack_ffffffffffffff28 = local_8;
    anon_unknown_21::load_wizard_and_decompressor
              (in_stack_fffffffffffffdb8,(version *)in_stack_fffffffffffffdb0._M_w,
               (header *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               (entry_types)in_stack_fffffffffffffdc0._M_w);
  }
  entry_type_00 = (enum_type)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  pbVar6 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd40);
  entries_02 = local_8;
  load_entries<setup::message_entry>
            ((info *)CONCAT44(entry_type,in_stack_fffffffffffffdd8),in_stack_fffffffffffffdd0,
             (entry_types)in_stack_fffffffffffffde0._M_w,(size_t)pbVar6,
             (vector<setup::message_entry,_std::allocator<setup::message_entry>_> *)
             in_stack_fffffffffffffdc0._M_w,entry_type_00);
  entries_01._M_w =
       (_WordT)std::
               unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            *)in_stack_fffffffffffffd40);
  this_01 = local_8;
  load_entries<setup::permission_entry>
            (in_stack_fffffffffffffda8,(istream *)in_stack_fffffffffffffda0,
             (entry_types)in_stack_fffffffffffffdb0._M_w,in_stack_fffffffffffffd98,
             in_stack_fffffffffffffd90,eVar8);
  pbVar6 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd40);
  entries_00._flags.super__Base_bitset<1UL>._M_w._7_1_ = uVar2;
  entries_00._flags.super__Base_bitset<1UL>._M_w._0_7_ = in_stack_fffffffffffffe60;
  is_00 = local_8;
  load_entries<setup::type_entry>
            ((info *)in_stack_fffffffffffffe58.item,in_stack_fffffffffffffe50,entries_00,
             (size_t)in_stack_fffffffffffffe48,
             (vector<setup::type_entry,_std::allocator<setup::type_entry>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),entry_type_01);
  version = std::
            unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
            ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)in_stack_fffffffffffffd40);
  count_00 = local_8;
  load_entries<setup::component_entry>
            ((info *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),pbVar5,
             (entry_types)in_RDI._M_w,(size_t)count,result_00,entry_type_02);
  eVar8 = (enum_type)((ulong)count >> 0x20);
  header = (header *)
           std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd40);
  result_01 = local_8;
  load_entries<setup::task_entry>
            ((info *)CONCAT44(entry_type_03,in_stack_fffffffffffffe98),(istream *)in_RDI._M_w,
             (entry_types)in_stack_fffffffffffffea0._M_w,
             CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (vector<setup::task_entry,_std::allocator<setup::task_entry>_> *)pbVar5,eVar8);
  info = (info *)std::
                 unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                              *)in_stack_fffffffffffffd40);
  entry_type_04 = local_8._4_4_;
  load_entries<setup::directory_entry>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (entry_types)in_stack_fffffffffffffee0._M_w,in_stack_fffffffffffffec8,
             (vector<setup::directory_entry,_std::allocator<setup::directory_entry>_> *)
             in_stack_fffffffffffffec0._M_w,(enum_type)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               *)in_stack_fffffffffffffd40);
  load_entries<setup::file_entry>
            ((info *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,(entry_types)in_stack_ffffffffffffff80._M_current,
             (size_t)this_03,
             (vector<setup::file_entry,_std::allocator<setup::file_entry>_> *)result.item,eVar9);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               *)in_stack_fffffffffffffd40);
  load_entries<setup::icon_entry>
            ((info *)in_stack_ffffffffffffffa8._M_w,(istream *)in_stack_ffffffffffffffa0.item,
             (entry_types)entries_03,(size_t)in_stack_ffffffffffffff98,
             (vector<setup::icon_entry,_std::allocator<setup::icon_entry>_> *)
             in_stack_ffffffffffffff90._M_current,entry_type_05);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               *)in_stack_fffffffffffffd40);
  load_entries<setup::ini_entry>
            ((info *)this_01,(istream *)is_00,(entry_types)entries_02,count_00,
             (vector<setup::ini_entry,_std::allocator<setup::ini_entry>_> *)result_01,entry_type_04)
  ;
  eVar8 = (enum_type)((ulong)count_00 >> 0x20);
  pbVar5 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd40);
  load_entries<setup::registry_entry>
            ((info *)in_stack_ffffffffffffff28,(istream *)entries_02,
             (entry_types)in_stack_ffffffffffffff30._M_w,this_01,
             (vector<setup::registry_entry,_std::allocator<setup::registry_entry>_> *)is_00,eVar8);
  what = std::
         unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
         ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      *)in_stack_fffffffffffffd40);
  load_entries<setup::delete_entry>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             (entry_types)in_stack_fffffffffffffec0._M_w,
             (size_t)in_stack_fffffffffffffea8._M_head_impl,
             (vector<setup::delete_entry,_std::allocator<setup::delete_entry>_> *)
             in_stack_fffffffffffffea0._M_w,entry_type_03);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               *)in_stack_fffffffffffffd40);
  load_entries<setup::delete_entry>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             (entry_types)in_stack_fffffffffffffec0._M_w,
             (size_t)in_stack_fffffffffffffea8._M_head_impl,
             (vector<setup::delete_entry,_std::allocator<setup::delete_entry>_> *)
             in_stack_fffffffffffffea0._M_w,entry_type_03);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               *)in_stack_fffffffffffffd40);
  load_entries<setup::run_entry>
            ((info *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,(entry_types)in_stack_ffffffffffffff80._M_current,
             (size_t)this_03,
             (vector<setup::run_entry,_std::allocator<setup::run_entry>_> *)result.item,eVar9);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               *)in_stack_fffffffffffffd40);
  load_entries<setup::run_entry>
            ((info *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,(entry_types)in_stack_ffffffffffffff80._M_current,
             (size_t)this_03,
             (vector<setup::run_entry,_std::allocator<setup::run_entry>_> *)result.item,eVar9);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number
                    ((int_adapter<unsigned_int> *)in_RDI._M_w);
  if (0x3ffffff < uVar3) {
    std::
    unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
    ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 *)in_stack_fffffffffffffd40);
    anon_unknown_21::load_wizard_and_decompressor
              (pbVar6,(version *)version,header,info,(entry_types)entries_01._M_w);
  }
  anon_unknown_21::check_is_end((pointer *)pbVar5,(char *)what);
  stream::block_reader::get(in_stack_00000e68,in_stack_00000e60);
  this_00 = (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             *)&stack0xffffffffffffffc8;
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator=(this_00,(unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                       *)&stack0xfffffffffffffea8);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(this_00);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator*(this_00);
  load_entries<setup::data_entry>
            ((info *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             (istream *)in_stack_fffffffffffffdf0._M_current,
             (entry_types)in_stack_fffffffffffffe00._M_current,
             CONCAT17(in_stack_fffffffffffffdef,
                      CONCAT16(in_stack_fffffffffffffdee,
                               CONCAT15(in_stack_fffffffffffffded,
                                        CONCAT14(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                )))),
             (vector<setup::data_entry,_std::allocator<setup::data_entry>_> *)
             in_stack_fffffffffffffde0._M_w,entry_type);
  anon_unknown_21::check_is_end((pointer *)pbVar5,(char *)what);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

void info::try_load(std::istream & is, entry_types entries, util::codepage_id force_codepage) {
	
	debug("trying to load setup headers for version " << version);
	
	if((entries & (Messages | NoSkip)) || (!version.is_unicode() && !force_codepage)) {
		entries |= Languages;
	}
	
	stream::block_reader::pointer reader = stream::block_reader::get(is, version);
	
	debug("loading main header");
	header.load(*reader, version);
	
	debug("loading languages");
	load_entries(*reader, entries, header.language_count, languages, Languages);
	
	debug("determining encoding");
	if(version.is_unicode()) {
		// Unicode installers are always UTF16-LE, do not allow users to override that.
		codepage = util::cp_utf16le;
	} else if(force_codepage) {
		codepage = force_codepage;
	} else if(languages.empty()) {
		codepage = util::cp_windows1252;
	} else {
		// Non-Unicode installers do not have a defined codepage but instead just assume the
		// codepage of the system the installer is run on.
		// Look at the list of available languages to guess a suitable codepage.
		codepage = languages[0].codepage;
		BOOST_FOREACH(const language_entry & language, languages) {
			if(language.codepage == util::cp_windows1252) {
				codepage = util::cp_windows1252;
				break;
			}
		}
	}
	
	header.decode(codepage);
	BOOST_FOREACH(language_entry & language, languages) {
		language.decode(codepage);
	}
	
	if(version < INNO_VERSION(4, 0, 0)) {
		debug("loading images and plugins");
		load_wizard_and_decompressor(*reader, version, header, *this, entries);
	}
	
	debug("loading messages");
	load_entries(*reader, entries, header.message_count, messages, Messages);
	debug("loading permissions");
	load_entries(*reader, entries, header.permission_count, permissions, Permissions);
	debug("loading types");
	load_entries(*reader, entries, header.type_count, types, Types);
	debug("loading components");
	load_entries(*reader, entries, header.component_count, components, Components);
	debug("loading tasks");
	load_entries(*reader, entries, header.task_count, tasks, Tasks);
	debug("loading directories");
	load_entries(*reader, entries, header.directory_count, directories, Directories);
	debug("loading files");
	load_entries(*reader, entries, header.file_count, files, Files);
	debug("loading icons");
	load_entries(*reader, entries, header.icon_count, icons, Icons);
	debug("loading ini entries");
	load_entries(*reader, entries, header.ini_entry_count, ini_entries, IniEntries);
	debug("loading registry entries");
	load_entries(*reader, entries, header.registry_entry_count, registry_entries, RegistryEntries);
	debug("loading delete entries");
	load_entries(*reader, entries, header.delete_entry_count, delete_entries, DeleteEntries);
	debug("loading uninstall delete entries");
	load_entries(*reader, entries, header.uninstall_delete_entry_count, uninstall_delete_entries,
	             UninstallDeleteEntries);
	debug("loading run entries");
	load_entries(*reader, entries, header.run_entry_count, run_entries, RunEntries);
	debug("loading uninstall run entries");
	load_entries(*reader, entries, header.uninstall_run_entry_count, uninstall_run_entries,
	             UninstallRunEntries);
	
	if(version >= INNO_VERSION(4, 0, 0)) {
		debug("loading images and plugins");
		load_wizard_and_decompressor(*reader, version, header, *this, entries);
	}
	
	// restart the compression stream
	check_is_end(reader, "unknown data at end of primary header stream");
	reader = stream::block_reader::get(is, version);
	
	debug("loading data entries");
	load_entries(*reader, entries, header.data_entry_count, data_entries, DataEntries);
	
	check_is_end(reader, "unknown data at end of secondary header stream");
}